

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O3

aom_noise_status_t
aom_noise_model_update
          (aom_noise_model_t *noise_model,uint8_t **data,uint8_t **denoised,int w,int h,int *stride,
          int *chroma_sub_log2,uint8_t *flat_blocks,int block_size)

{
  aom_noise_strength_solver_t *solver;
  int *piVar1;
  aom_noise_state_t *state;
  aom_noise_state_t *state_00;
  size_t sVar2;
  double dVar3;
  int iVar4;
  double *pdVar5;
  int (*paiVar6) [2];
  double dVar7;
  int iVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  void *memblk;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  ushort uVar19;
  ushort uVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  double *pdVar25;
  double *pdVar26;
  bool bVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  uint8_t *puVar33;
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  uint uVar42;
  int iVar43;
  uint uVar44;
  long lVar45;
  ulong uVar46;
  uint8_t *puVar47;
  int iVar48;
  uint uVar49;
  long lVar50;
  int max_h;
  uint uVar51;
  uint uVar52;
  ulong uVar53;
  uint8_t *puVar54;
  uint8_t *puVar55;
  int max_w;
  long lVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  byte *local_180;
  uint8_t *local_178;
  ulong local_158;
  int *local_130;
  byte local_80 [4];
  int local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  aom_noise_state_t *local_50;
  byte *local_48;
  uint8_t *local_40;
  long local_38;
  
  uVar10 = (block_size + w + -1) / block_size;
  uVar11 = (block_size + h + -1) / block_size;
  if (block_size < 2) {
    fprintf(_stderr,"block_size = %d must be > 1\n",(ulong)(uint)block_size);
  }
  else {
    uVar28 = (noise_model->params).lag * 2;
    if ((int)uVar28 < block_size) {
      local_48 = (byte *)(chroma_sub_log2 + 1);
      lVar56 = 0;
      do {
        lVar30 = (long)*(int *)((long)&noise_model->latest_state[0].eqns.n + lVar56);
        sVar2 = lVar30 * 8;
        memset(*(void **)((long)&noise_model->latest_state[0].eqns.A + lVar56),0,lVar30 * sVar2);
        memset(*(void **)((long)&noise_model->latest_state[0].eqns.x + lVar56),0,sVar2);
        memset(*(void **)((long)&noise_model->latest_state[0].eqns.b + lVar56),0,sVar2);
        *(undefined4 *)((long)&noise_model->latest_state[0].num_observations + lVar56) = 0;
        lVar30 = (long)*(int *)((long)&noise_model->latest_state[0].strength_solver.eqns.n + lVar56)
        ;
        sVar2 = lVar30 * 8;
        memset(*(void **)((long)&noise_model->latest_state[0].strength_solver.eqns.A + lVar56),0,
               lVar30 * sVar2);
        memset(*(void **)((long)&noise_model->latest_state[0].strength_solver.eqns.x + lVar56),0,
               sVar2);
        memset(*(void **)((long)&noise_model->latest_state[0].strength_solver.eqns.b + lVar56),0,
               sVar2);
        *(undefined4 *)((long)&noise_model->latest_state[0].strength_solver.num_equations + lVar56)
             = 0;
        *(undefined8 *)((long)&noise_model->latest_state[0].strength_solver.total + lVar56) = 0;
        lVar56 = lVar56 + 0x70;
      } while (lVar56 != 0x150);
      if (0 < (int)(uVar11 * uVar10)) {
        uVar22 = 0;
        uVar28 = 0;
        do {
          uVar28 = (uVar28 + 1) - (uint)(flat_blocks[uVar22] == '\0');
          uVar22 = uVar22 + 1;
        } while (uVar11 * uVar10 != uVar22);
        if (1 < uVar28) {
          local_58 = (long)(int)uVar10;
          local_68 = (ulong)uVar11;
          uVar22 = (ulong)uVar10;
          local_50 = noise_model->combined_state;
          lVar56 = 0;
          bVar9 = false;
          do {
            local_7c = 0;
            local_80[0] = 0;
            local_80[1] = 0;
            local_80[2] = 0;
            local_80[3] = 0;
            if (lVar56 == 0) {
              puVar55 = (uint8_t *)0x0;
              local_180 = local_80;
              local_130 = &local_7c;
              puVar54 = (uint8_t *)0x0;
            }
            else {
              puVar55 = *data;
              puVar54 = *denoised;
              local_180 = local_48;
              local_130 = chroma_sub_log2;
            }
            puVar33 = data[lVar56];
            if ((puVar33 == (uint8_t *)0x0) ||
               (puVar47 = denoised[lVar56], puVar47 == (uint8_t *)0x0)) break;
            iVar12 = stride[lVar56];
            iVar4 = *stride;
            iVar13 = (noise_model->params).lag;
            uVar28 = noise_model->n;
            lVar30 = (long)(int)uVar28;
            iVar21 = (noise_model->params).bit_depth;
            pdVar26 = noise_model->latest_state[lVar56].eqns.A;
            pdVar5 = noise_model->latest_state[lVar56].eqns.b;
            memblk = aom_malloc(lVar30 * 8 + 8);
            if (memblk == (void *)0x0) {
              aom_noise_model_update_cold_5();
              return '\x04';
            }
            state = noise_model->latest_state + lVar56;
            if (0 < (int)uVar11) {
              dVar57 = (double)~(-1 << ((byte)iVar21 & 0x1f));
              uVar44 = noise_model->latest_state[lVar56].eqns.n;
              uVar36 = (ulong)uVar44;
              bVar27 = puVar54 != (uint8_t *)0x0 && puVar55 != (uint8_t *)0x0;
              dVar57 = dVar57 * dVar57;
              iVar21 = 0;
              uVar35 = 0;
              do {
                bVar18 = *local_180;
                if (0 < (int)uVar10) {
                  lVar31 = uVar35 * local_58;
                  local_40 = flat_blocks + (uVar35 - 1) * local_58;
                  uVar53 = 0;
                  do {
                    uVar51 = (uint)block_size >> ((byte)*local_130 & 0x1f);
                    if (flat_blocks[uVar53 + lVar31] != '\0') {
                      if ((uVar35 == 0) || (iVar39 = 0, local_40[uVar53] == '\0')) {
                        iVar39 = iVar13;
                      }
                      if ((uVar53 == 0) || (iVar37 = 0, flat_blocks[uVar53 + lVar31 + -1] == '\0'))
                      {
                        iVar37 = iVar13;
                      }
                      iVar48 = h >> (*local_180 & 0x1f);
                      uVar52 = (uint)block_size >> (*local_180 & 0x1f);
                      uVar42 = iVar48 - uVar52 * (int)uVar35;
                      if ((int)uVar52 <= (int)uVar42) {
                        uVar42 = uVar52;
                      }
                      iVar43 = iVar13;
                      if (((long)(uVar53 + 1) < local_58) &&
                         (iVar43 = 0, flat_blocks[uVar53 + lVar31 + 1] == '\0')) {
                        iVar43 = iVar13;
                      }
                      if (iVar39 < (int)uVar42) {
                        iVar38 = (int)uVar53 * uVar51;
                        iVar34 = (w >> ((byte)*local_130 & 0x1f)) - (iVar13 + iVar38);
                        iVar43 = uVar51 - iVar43;
                        if (iVar34 < iVar43) {
                          iVar43 = iVar34;
                        }
                        local_158 = (ulong)iVar39;
                        uVar32 = (ulong)(int)(iVar48 + uVar52 * iVar21);
                        if ((long)(ulong)uVar52 < (long)uVar32) {
                          uVar32 = (ulong)uVar52;
                        }
                        do {
                          if (iVar37 < iVar43) {
                            local_78._0_4_ = (noise_model->params).use_highbd;
                            lVar45 = local_158 + ((uint)block_size >> (bVar18 & 0x1f)) * uVar35;
                            lVar40 = lVar45 * iVar12;
                            paiVar6 = noise_model->coords;
                            lVar50 = (long)iVar37;
                            do {
                              lVar24 = lVar50 + iVar38;
                              iVar39 = (int)lVar24;
                              iVar48 = (int)lVar45;
                              if ((int)local_78 == 0) {
                                if (0 < (int)uVar28) {
                                  uVar23 = 0;
                                  do {
                                    iVar34 = (paiVar6[uVar23][1] + iVar48) * iVar12 +
                                             paiVar6[uVar23][0] + iVar39;
                                    *(double *)((long)memblk + uVar23 * 8) =
                                         (double)puVar33[iVar34] - (double)puVar47[iVar34];
                                    uVar23 = uVar23 + 1;
                                  } while (uVar28 != uVar23);
                                }
                                lVar24 = lVar40 + lVar24;
                                bVar15 = puVar33[lVar24];
                                bVar14 = puVar47[lVar24];
                                if (bVar27) {
                                  dVar59 = NAN;
                                  if (*(int *)local_180 != 0x1f) {
                                    bVar16 = (byte)*(int *)local_180;
                                    bVar17 = (byte)*local_130;
                                    uVar51 = 1 << (bVar17 & 0x1f);
                                    bVar17 = bVar17 & 0x1f;
                                    if ((int)uVar51 < 2) {
                                      uVar51 = 1;
                                    }
                                    iVar34 = (iVar48 << (bVar16 & 0x1f)) * iVar4 +
                                             (iVar39 << bVar17);
                                    iVar48 = 0 << bVar17;
                                    dVar59 = 0.0;
                                    iVar39 = 0;
                                    dVar60 = 0.0;
                                    do {
                                      uVar23 = (ulong)uVar51;
                                      iVar8 = iVar34;
                                      if (*local_130 != 0x1f) {
                                        do {
                                          dVar59 = dVar59 + (double)puVar55[iVar8];
                                          dVar60 = dVar60 + (double)puVar54[iVar8];
                                          uVar23 = uVar23 - 1;
                                          iVar8 = iVar8 + 1;
                                        } while (uVar23 != 0);
                                        iVar39 = iVar39 + uVar51;
                                      }
                                      iVar48 = iVar48 + 1;
                                      iVar34 = iVar34 + iVar4;
                                    } while (iVar48 != 1 << (bVar16 & 0x1f));
                                    dVar59 = (dVar59 - dVar60) / (double)iVar39;
                                  }
                                  *(double *)((long)memblk + lVar30 * 8) = dVar59;
                                }
                                uVar19 = (ushort)bVar15;
                                uVar20 = (ushort)bVar14;
                              }
                              else {
                                if (0 < (int)uVar28) {
                                  uVar23 = 0;
                                  do {
                                    lVar41 = (long)((paiVar6[uVar23][1] + iVar48) * iVar12 +
                                                   paiVar6[uVar23][0] + iVar39);
                                    *(double *)((long)memblk + uVar23 * 8) =
                                         (double)*(ushort *)(puVar33 + lVar41 * 2) -
                                         (double)*(ushort *)(puVar47 + lVar41 * 2);
                                    uVar23 = uVar23 + 1;
                                  } while (uVar28 != uVar23);
                                }
                                lVar24 = lVar40 + lVar24;
                                uVar19 = *(ushort *)(puVar33 + lVar24 * 2);
                                uVar20 = *(ushort *)(puVar47 + lVar24 * 2);
                                if (bVar27) {
                                  dVar59 = NAN;
                                  if (*(int *)local_180 != 0x1f) {
                                    bVar14 = (byte)*(int *)local_180;
                                    bVar15 = (byte)*local_130;
                                    uVar51 = 1 << (bVar15 & 0x1f);
                                    bVar15 = bVar15 & 0x1f;
                                    if ((int)uVar51 < 2) {
                                      uVar51 = 1;
                                    }
                                    iVar39 = (iVar48 << (bVar14 & 0x1f)) * iVar4 +
                                             (iVar39 << bVar15);
                                    dVar59 = 0.0;
                                    dVar60 = 0.0;
                                    iVar34 = 0;
                                    iVar48 = 0 << bVar15;
                                    do {
                                      uVar23 = (ulong)uVar51;
                                      iVar8 = iVar39;
                                      if (*local_130 != 0x1f) {
                                        do {
                                          dVar59 = dVar59 + (double)*(ushort *)
                                                                     (puVar54 + (long)iVar8 * 2);
                                          dVar60 = dVar60 + (double)*(ushort *)
                                                                     (puVar55 + (long)iVar8 * 2);
                                          uVar23 = uVar23 - 1;
                                          iVar8 = iVar8 + 1;
                                        } while (uVar23 != 0);
                                        iVar48 = iVar48 + uVar51;
                                      }
                                      iVar34 = iVar34 + 1;
                                      iVar39 = iVar39 + iVar4;
                                    } while (iVar34 != 1 << (bVar14 & 0x1f));
                                    dVar59 = (dVar60 - dVar59) / (double)iVar48;
                                  }
                                  *(double *)((long)memblk + lVar30 * 8) = dVar59;
                                }
                              }
                              if (0 < (int)uVar44) {
                                uVar23 = 0;
                                pdVar25 = pdVar26;
                                do {
                                  uVar46 = 0;
                                  do {
                                    pdVar25[uVar46] =
                                         (*(double *)((long)memblk + uVar23 * 8) *
                                         *(double *)((long)memblk + uVar46 * 8)) / dVar57 +
                                         pdVar25[uVar46];
                                    uVar46 = uVar46 + 1;
                                  } while (uVar36 != uVar46);
                                  pdVar5[uVar23] =
                                       (*(double *)((long)memblk + uVar23 * 8) *
                                       ((double)uVar19 - (double)uVar20)) / dVar57 + pdVar5[uVar23];
                                  uVar23 = uVar23 + 1;
                                  pdVar25 = pdVar25 + uVar36;
                                } while (uVar23 != uVar36);
                              }
                              state->num_observations = state->num_observations + 1;
                              lVar50 = lVar50 + 1;
                            } while (lVar50 != iVar43);
                          }
                          local_158 = local_158 + 1;
                          local_38 = uVar53 + 1;
                        } while (local_158 != uVar32);
                      }
                    }
                    uVar53 = uVar53 + 1;
                    local_60 = uVar35;
                  } while (uVar53 != uVar22);
                }
                uVar35 = uVar35 + 1;
                iVar21 = iVar21 + -1;
              } while (uVar35 != local_68);
            }
            aom_free(memblk);
            iVar12 = ar_equation_system_solve(state,(uint)(lVar56 != 0));
            if (iVar12 == 0) {
              if (lVar56 == 0) {
                aom_noise_model_update_cold_1();
                return '\x04';
              }
              set_chroma_coefficient_fallback_soln(&state->eqns);
            }
            dVar57 = (double)CONCAT44(local_78._4_4_,(int)local_78);
            solver = &state->strength_solver;
            if (0 < (int)uVar11) {
              puVar54 = data[lVar56];
              iVar12 = stride[lVar56];
              lVar30 = (long)iVar12;
              local_178 = puVar54;
              if (puVar55 != (uint8_t *)0x0) {
                iVar12 = *stride;
                local_178 = puVar55;
              }
              puVar55 = denoised[lVar56];
              dVar59 = noise_model->latest_state[0].ar_gain;
              dVar60 = state->ar_gain;
              pdVar26 = (state->eqns).x;
              iVar4 = noise_model->n;
              lVar31 = (long)iVar12;
              uVar35 = 0;
              do {
                if (0 < (int)uVar10) {
                  iVar13 = ((uint)block_size >> (*local_180 & 0x1f)) * (int)uVar35;
                  lVar50 = iVar13 * lVar30;
                  iVar12 = 0;
                  uVar36 = 0;
                  do {
                    local_78._4_4_ = (undefined4)((ulong)dVar57 >> 0x20);
                    bVar18 = (byte)*local_130;
                    uVar28 = (uint)block_size >> (bVar18 & 0x1f);
                    if (flat_blocks[uVar36 + uVar35 * uVar22] != '\0') {
                      iVar39 = uVar28 * (int)uVar36;
                      bVar14 = (byte)*(undefined4 *)local_180;
                      iVar21 = h >> (bVar14 & 0x1f);
                      bVar15 = bVar14 & 0x1f;
                      uVar51 = (uint)block_size >> bVar15;
                      uVar44 = iVar21 - uVar51 * (int)uVar35;
                      if ((int)uVar51 <= (int)uVar44) {
                        uVar44 = uVar51;
                      }
                      iVar37 = w >> (bVar18 & 0x1f);
                      uVar42 = iVar37 - iVar39;
                      if ((int)uVar28 <= iVar37 - iVar39) {
                        uVar42 = uVar28;
                      }
                      if (block_size < (int)(uVar44 * uVar42)) {
                        iVar43 = iVar39 << (bVar18 & 0x1f);
                        iVar48 = iVar13 << (bVar14 & 0x1f);
                        uVar52 = h - iVar48;
                        uVar44 = block_size;
                        if ((int)uVar52 < block_size) {
                          uVar44 = uVar52;
                        }
                        iVar34 = (noise_model->params).use_highbd;
                        local_78 = (double)CONCAT44(local_78._4_4_,iVar34);
                        uVar49 = w - iVar43;
                        uVar29 = block_size;
                        if ((int)uVar49 < block_size) {
                          uVar29 = uVar49;
                        }
                        if (iVar34 == 0) {
                          if ((int)uVar52 < 1) goto LAB_002a384a;
                          uVar53 = 1;
                          if (1 < (int)uVar29) {
                            uVar53 = (ulong)uVar29;
                          }
                          puVar33 = local_178 + (long)iVar43 + iVar48 * lVar31;
                          dVar57 = 0.0;
                          uVar32 = 0;
                          do {
                            if (0 < (int)uVar49) {
                              uVar23 = 0;
                              do {
                                dVar57 = dVar57 + (double)puVar33[uVar23];
                                uVar23 = uVar23 + 1;
                              } while (uVar53 != uVar23);
                            }
                            uVar32 = uVar32 + 1;
                            puVar33 = puVar33 + lVar31;
                          } while (uVar32 != uVar44);
                        }
                        else if ((int)uVar52 < 1) {
LAB_002a384a:
                          dVar57 = 0.0;
                        }
                        else {
                          uVar53 = 1;
                          if (1 < (int)uVar29) {
                            uVar53 = (ulong)uVar29;
                          }
                          puVar33 = local_178 + (long)iVar48 * lVar31 * 2 + (long)iVar43 * 2;
                          dVar57 = 0.0;
                          uVar32 = 0;
                          do {
                            if (0 < (int)uVar49) {
                              uVar23 = 0;
                              do {
                                dVar57 = dVar57 + (double)*(ushort *)(puVar33 + uVar23 * 2);
                                uVar23 = uVar23 + 1;
                              } while (uVar53 != uVar23);
                            }
                            uVar32 = uVar32 + 1;
                            puVar33 = puVar33 + lVar31 * 2;
                          } while (uVar32 != uVar44);
                        }
                        uVar52 = iVar21 - iVar13;
                        if ((int)uVar51 <= (int)uVar52) {
                          uVar52 = uVar51;
                        }
                        if (iVar34 == 0) {
                          if ((int)uVar52 < 1) goto LAB_002a3993;
                          uVar51 = iVar37 + uVar28 * iVar12;
                          if ((int)uVar28 < (int)uVar51) {
                            uVar51 = uVar28;
                          }
                          puVar33 = puVar55 + iVar39 + lVar50;
                          puVar47 = puVar54 + iVar39 + lVar50;
                          dVar61 = 0.0;
                          uVar53 = (ulong)(0 >> bVar15);
                          dVar62 = 0.0;
                          do {
                            if (0 < (int)uVar42) {
                              uVar32 = 0;
                              do {
                                dVar58 = (double)puVar47[uVar32] - (double)puVar33[uVar32];
                                dVar62 = dVar62 + dVar58;
                                dVar61 = dVar61 + dVar58 * dVar58;
                                uVar32 = uVar32 + 1;
                              } while (uVar51 != uVar32);
                            }
                            uVar53 = uVar53 + 1;
                            puVar33 = puVar33 + lVar30;
                            puVar47 = puVar47 + lVar30;
                          } while (uVar53 != uVar52);
                        }
                        else if ((int)uVar52 < 1) {
LAB_002a3993:
                          dVar62 = 0.0;
                          dVar61 = 0.0;
                        }
                        else {
                          uVar51 = iVar37 + uVar28 * iVar12;
                          if ((int)uVar28 < (int)uVar51) {
                            uVar51 = uVar28;
                          }
                          puVar33 = puVar55 + (iVar39 + lVar50) * 2;
                          puVar47 = puVar54 + (iVar39 + lVar50) * 2;
                          dVar61 = 0.0;
                          uVar53 = (ulong)(0 >> bVar15);
                          dVar62 = 0.0;
                          do {
                            if (0 < (int)uVar42) {
                              uVar32 = 0;
                              do {
                                dVar58 = (double)*(ushort *)(puVar47 + uVar32 * 2) -
                                         (double)*(ushort *)(puVar33 + uVar32 * 2);
                                dVar62 = dVar62 + dVar58;
                                dVar61 = dVar61 + dVar58 * dVar58;
                                uVar32 = uVar32 + 1;
                              } while (uVar51 != uVar32);
                            }
                            uVar53 = uVar53 + 1;
                            puVar33 = puVar33 + lVar30 * 2;
                            puVar47 = puVar47 + lVar30 * 2;
                          } while (uVar53 != uVar52);
                        }
                        dVar57 = dVar57 / (double)(int)(uVar44 * uVar29);
                        if (lVar56 == 0) {
                          dVar58 = 0.0;
                        }
                        else {
                          dVar58 = noise_model->latest_state[0].strength_solver.min_intensity;
                          dVar3 = noise_model->latest_state[0].strength_solver.max_intensity;
                          dVar7 = dVar3;
                          if (dVar57 <= dVar3) {
                            dVar7 = dVar57;
                          }
                          iVar37 = noise_model->latest_state[0].strength_solver.num_bins;
                          iVar39 = iVar37 + -1;
                          local_78 = (((double)(-(ulong)(dVar57 < dVar58) & (ulong)dVar58 |
                                               ~-(ulong)(dVar57 < dVar58) & (ulong)dVar7) - dVar58)
                                     * (double)iVar39) / (dVar3 - dVar58);
                          uStack_70 = 0;
                          dVar58 = floor(local_78);
                          iVar21 = (int)dVar58 + 1;
                          if (iVar21 < iVar37) {
                            iVar39 = iVar21;
                          }
                          pdVar5 = noise_model->latest_state[0].strength_solver.eqns.x;
                          dVar58 = ((1.0 - (local_78 - (double)(int)dVar58)) * pdVar5[(int)dVar58] +
                                   (local_78 - (double)(int)dVar58) * pdVar5[iVar39]) * dVar59 *
                                   pdVar26[iVar4];
                        }
                        dVar62 = dVar62 / (double)(int)(uVar52 * uVar42);
                        dVar62 = dVar61 / (double)(int)(uVar52 * uVar42) - dVar62 * dVar62;
                        dVar61 = dVar62 * 0.0625;
                        dVar62 = dVar62 - dVar58 * dVar58;
                        if (dVar61 <= dVar62) {
                          dVar61 = dVar62;
                        }
                        if (dVar61 < 0.0) {
                          dVar61 = sqrt(dVar61);
                        }
                        else {
                          dVar61 = SQRT(dVar61);
                        }
                        aom_noise_strength_solver_add_measurement(solver,dVar57,dVar61 / dVar60);
                        dVar57 = local_78;
                      }
                    }
                    uVar36 = uVar36 + 1;
                    iVar12 = iVar12 + -1;
                  } while (uVar36 != uVar22);
                }
                uVar35 = uVar35 + 1;
              } while (uVar35 != local_68);
            }
            local_78 = dVar57;
            iVar12 = aom_noise_strength_solver_solve(solver);
            if (iVar12 == 0) {
              aom_noise_model_update_cold_4();
              return '\x04';
            }
            if ((lVar56 == 0) && (0 < noise_model->combined_state[0].strength_solver.num_equations))
            {
              iVar12 = (noise_model->params).bit_depth;
              dVar57 = aom_normalized_cross_correlation
                                 (noise_model->latest_state[0].eqns.x,
                                  noise_model->combined_state[0].eqns.x,
                                  noise_model->combined_state[0].eqns.n);
              bVar27 = true;
              if (0.9 <= dVar57) {
                iVar4 = noise_model->latest_state[0].strength_solver.num_bins;
                uVar28 = noise_model->latest_state[0].strength_solver.eqns.n;
                uVar35 = (ulong)uVar28;
                if ((int)uVar28 < 1) {
                  dVar57 = 0.0;
                  dVar59 = 0.0;
                }
                else {
                  dVar59 = 0.0;
                  lVar30 = 0;
                  lVar31 = 0;
                  dVar57 = 0.0;
                  do {
                    dVar60 = 0.0;
                    if (0 < (int)uVar35) {
                      pdVar26 = (double *)
                                ((long)noise_model->latest_state[0].strength_solver.eqns.A + lVar30)
                      ;
                      uVar36 = uVar35 & 0xffffffff;
                      do {
                        dVar60 = dVar60 + *pdVar26;
                        pdVar26 = pdVar26 + (uVar35 & 0xffffffff);
                        uVar36 = uVar36 - 1;
                      } while (uVar36 != 0);
                    }
                    if (dVar60 < 0.0) {
                      dVar60 = sqrt(dVar60);
                    }
                    else {
                      dVar60 = SQRT(dVar60);
                    }
                    dVar57 = dVar57 + ABS(noise_model->latest_state[0].strength_solver.eqns.x
                                          [lVar31] -
                                          noise_model->combined_state[0].strength_solver.eqns.x
                                          [lVar31]) * dVar60;
                    dVar59 = dVar59 + dVar60;
                    lVar31 = lVar31 + 1;
                    uVar35 = (ulong)noise_model->latest_state[0].strength_solver.eqns.n;
                    lVar30 = lVar30 + 8;
                  } while (lVar31 < (long)uVar35);
                }
                if (((1.0 / (double)iVar4) * dVar57) / dVar59 <=
                    (double)(1 << ((char)iVar12 - 8U & 0x1f)) * 0.005 && !bVar9) goto LAB_002a3bbd;
              }
            }
            else {
              bVar27 = true;
              if (!bVar9) {
LAB_002a3bbd:
                state_00 = local_50 + lVar56;
                local_50[lVar56].num_observations =
                     local_50[lVar56].num_observations + state->num_observations;
                equation_system_add(&state_00->eqns,&state->eqns);
                iVar12 = ar_equation_system_solve(state_00,(uint)(lVar56 != 0));
                if (iVar12 == 0) {
                  if (lVar56 == 0) {
                    aom_noise_model_update_cold_2();
                    return '\x04';
                  }
                  set_chroma_coefficient_fallback_soln(&state_00->eqns);
                }
                equation_system_add(&(state_00->strength_solver).eqns,&solver->eqns);
                piVar1 = &(state_00->strength_solver).num_equations;
                *piVar1 = *piVar1 + (state->strength_solver).num_equations;
                (state_00->strength_solver).total =
                     (state->strength_solver).total + (state_00->strength_solver).total;
                iVar12 = aom_noise_strength_solver_solve(&state_00->strength_solver);
                bVar27 = false;
                if (iVar12 == 0) {
                  aom_noise_model_update_cold_3();
                  return '\x04';
                }
              }
            }
            bVar9 = bVar27;
            lVar56 = lVar56 + 1;
          } while (lVar56 != 3);
          return bVar9 * '\x03';
        }
      }
      aom_noise_model_update_cold_6();
      return '\x02';
    }
    fprintf(_stderr,"block_size = %d must be >= %d\n",(ulong)(uint)block_size,(ulong)(uVar28 | 1));
  }
  return '\x01';
}

Assistant:

aom_noise_status_t aom_noise_model_update(
    aom_noise_model_t *const noise_model, const uint8_t *const data[3],
    const uint8_t *const denoised[3], int w, int h, int stride[3],
    int chroma_sub_log2[2], const uint8_t *const flat_blocks, int block_size) {
  const int num_blocks_w = (w + block_size - 1) / block_size;
  const int num_blocks_h = (h + block_size - 1) / block_size;
  int y_model_different = 0;
  int num_blocks = 0;
  int i = 0, channel = 0;

  if (block_size <= 1) {
    fprintf(stderr, "block_size = %d must be > 1\n", block_size);
    return AOM_NOISE_STATUS_INVALID_ARGUMENT;
  }

  if (block_size < noise_model->params.lag * 2 + 1) {
    fprintf(stderr, "block_size = %d must be >= %d\n", block_size,
            noise_model->params.lag * 2 + 1);
    return AOM_NOISE_STATUS_INVALID_ARGUMENT;
  }

  // Clear the latest equation system
  for (i = 0; i < 3; ++i) {
    equation_system_clear(&noise_model->latest_state[i].eqns);
    noise_model->latest_state[i].num_observations = 0;
    noise_strength_solver_clear(&noise_model->latest_state[i].strength_solver);
  }

  // Check that we have enough flat blocks
  for (i = 0; i < num_blocks_h * num_blocks_w; ++i) {
    if (flat_blocks[i]) {
      num_blocks++;
    }
  }

  if (num_blocks <= 1) {
    fprintf(stderr, "Not enough flat blocks to update noise estimate\n");
    return AOM_NOISE_STATUS_INSUFFICIENT_FLAT_BLOCKS;
  }

  for (channel = 0; channel < 3; ++channel) {
    int no_subsampling[2] = { 0, 0 };
    const uint8_t *alt_data = channel > 0 ? data[0] : 0;
    const uint8_t *alt_denoised = channel > 0 ? denoised[0] : 0;
    int *sub = channel > 0 ? chroma_sub_log2 : no_subsampling;
    const int is_chroma = channel != 0;
    if (!data[channel] || !denoised[channel]) break;
    if (!add_block_observations(noise_model, channel, data[channel],
                                denoised[channel], w, h, stride[channel], sub,
                                alt_data, alt_denoised, stride[0], flat_blocks,
                                block_size, num_blocks_w, num_blocks_h)) {
      fprintf(stderr, "Adding block observation failed\n");
      return AOM_NOISE_STATUS_INTERNAL_ERROR;
    }

    if (!ar_equation_system_solve(&noise_model->latest_state[channel],
                                  is_chroma)) {
      if (is_chroma) {
        set_chroma_coefficient_fallback_soln(
            &noise_model->latest_state[channel].eqns);
      } else {
        fprintf(stderr, "Solving latest noise equation system failed %d!\n",
                channel);
        return AOM_NOISE_STATUS_INTERNAL_ERROR;
      }
    }

    add_noise_std_observations(
        noise_model, channel, noise_model->latest_state[channel].eqns.x,
        data[channel], denoised[channel], w, h, stride[channel], sub, alt_data,
        stride[0], flat_blocks, block_size, num_blocks_w, num_blocks_h);

    if (!aom_noise_strength_solver_solve(
            &noise_model->latest_state[channel].strength_solver)) {
      fprintf(stderr, "Solving latest noise strength failed!\n");
      return AOM_NOISE_STATUS_INTERNAL_ERROR;
    }

    // Check noise characteristics and return if error.
    if (channel == 0 &&
        noise_model->combined_state[channel].strength_solver.num_equations >
            0 &&
        is_noise_model_different(noise_model)) {
      y_model_different = 1;
    }

    // Don't update the combined stats if the y model is different.
    if (y_model_different) continue;

    noise_model->combined_state[channel].num_observations +=
        noise_model->latest_state[channel].num_observations;
    equation_system_add(&noise_model->combined_state[channel].eqns,
                        &noise_model->latest_state[channel].eqns);
    if (!ar_equation_system_solve(&noise_model->combined_state[channel],
                                  is_chroma)) {
      if (is_chroma) {
        set_chroma_coefficient_fallback_soln(
            &noise_model->combined_state[channel].eqns);
      } else {
        fprintf(stderr, "Solving combined noise equation system failed %d!\n",
                channel);
        return AOM_NOISE_STATUS_INTERNAL_ERROR;
      }
    }

    noise_strength_solver_add(
        &noise_model->combined_state[channel].strength_solver,
        &noise_model->latest_state[channel].strength_solver);

    if (!aom_noise_strength_solver_solve(
            &noise_model->combined_state[channel].strength_solver)) {
      fprintf(stderr, "Solving combined noise strength failed!\n");
      return AOM_NOISE_STATUS_INTERNAL_ERROR;
    }
  }

  return y_model_different ? AOM_NOISE_STATUS_DIFFERENT_NOISE_TYPE
                           : AOM_NOISE_STATUS_OK;
}